

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_demovfs.c
# Opt level: O0

int demoSync(unqlite_file *pFile,int flags)

{
  int iVar1;
  int rc;
  DemoFile *p;
  int flags_local;
  unqlite_file *pFile_local;
  
  pFile_local._4_4_ = demoFlushBuffer((DemoFile *)pFile);
  if (pFile_local._4_4_ == 0) {
    iVar1 = fsync(*(int *)&pFile[2].pMethods);
    pFile_local._4_4_ = -2;
    if (iVar1 == 0) {
      pFile_local._4_4_ = 0;
    }
  }
  return pFile_local._4_4_;
}

Assistant:

static int demoSync(unqlite_file *pFile, int flags){
  DemoFile *p = (DemoFile*)pFile;
  int rc;

  rc = demoFlushBuffer(p);
  if( rc!=UNQLITE_OK ){
    return rc;
  }

#if defined(_MSC_VER) || defined(__MINGW32__)
  rc = _commit(p->fd);
#else
  rc = fsync(p->fd);
#endif /* defined(_MSC_VER) || defined(__MINGW32__) */
  return (rc==0 ? UNQLITE_OK : UNQLITE_IOERR);
}